

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalProcessPdu.cpp
# Opt level: O3

int __thiscall DIS::EnvironmentalProcessPdu::getMarshalledSize(EnvironmentalProcessPdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pEVar4;
  ulong uVar5;
  long lVar6;
  Environment listElement;
  Environment local_48;
  
  iVar1 = SyntheticEnvironmentFamilyPdu::getMarshalledSize
                    (&this->super_SyntheticEnvironmentFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_environementalProcessID);
  iVar3 = EntityType::getMarshalledSize(&this->_environmentType);
  iVar1 = iVar3 + iVar2 + iVar1 + 5;
  pEVar4 = (this->_environmentRecords).
           super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_environmentRecords).
      super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar4) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      local_48._vptr_Environment = (_func_int **)&PTR__Environment_0019fed8;
      local_48._padding2 = *(uchar *)((long)&pEVar4->_environmentType + lVar6);
      local_48._8_8_ = *(undefined8 *)((long)&pEVar4->_vptr_Environment + lVar6);
      iVar2 = Environment::getMarshalledSize(&local_48);
      iVar1 = iVar1 + iVar2;
      Environment::~Environment(&local_48);
      uVar5 = uVar5 + 1;
      pEVar4 = (this->_environmentRecords).
               super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x18;
    } while (uVar5 < (ulong)(((long)(this->_environmentRecords).
                                    super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 3)
                            * -0x5555555555555555));
  }
  return iVar1;
}

Assistant:

int EnvironmentalProcessPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SyntheticEnvironmentFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _environementalProcessID.getMarshalledSize();  // _environementalProcessID
   marshalSize = marshalSize + _environmentType.getMarshalledSize();  // _environmentType
   marshalSize = marshalSize + 1;  // _modelType
   marshalSize = marshalSize + 1;  // _environmentStatus
   marshalSize = marshalSize + 1;  // _numberOfEnvironmentRecords
   marshalSize = marshalSize + 2;  // _sequenceNumber

   for(unsigned long long idx=0; idx < _environmentRecords.size(); idx++)
   {
        Environment listElement = _environmentRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}